

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveNonJSOps.cpp
# Opt level: O1

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::StubUnsupportedJSOpsPass::create(StubUnsupportedJSOpsPass *this)

{
  _func_int **__s;
  
  __s = (_func_int **)operator_new(0x130);
  memset(__s,0,0x130);
  __s[1] = (_func_int *)0x0;
  __s[2] = (_func_int *)(__s + 4);
  __s[3] = (_func_int *)0x0;
  *(undefined1 *)(__s + 4) = 0;
  *(undefined1 *)(__s + 10) = 0;
  __s[0xb] = (_func_int *)0x0;
  __s[0xc] = (_func_int *)0x0;
  __s[0x21] = (_func_int *)0x0;
  __s[0x22] = (_func_int *)0x0;
  __s[0x23] = (_func_int *)0x0;
  __s[0x24] = (_func_int *)0x0;
  __s[0x25] = (_func_int *)0x0;
  *__s = (_func_int *)&PTR__WalkerPass_01095270;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::StubUnsupportedJSOpsPass,_wasm::Visitor<wasm::StubUnsupportedJSOpsPass,_void>_>_>
  ).super_Pass._vptr_Pass = __s;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<StubUnsupportedJSOpsPass>();
  }